

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_580a1::MapDriver::annotationHintWasTaken(MapDriver *this)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar2;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar3;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float fVar4;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float fVar5;
  float in_XMM1_Da;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec3 local_68;
  Vec3 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  if (this->dtZero == false) {
    this->hintTakenCount = this->hintTakenCount + 1;
  }
  fVar1 = this->halfWidth * 0.9;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(this);
  in_XMM1_Da = in_XMM1_Da * fVar1;
  fVar6 = in_XMM1_Da;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[2])(this);
  fVar6 = fVar6 * fVar1;
  fVar7 = fVar6;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  fVar2 = fVar7;
  local_48 = extraout_XMM0_Da_01;
  fStack_44 = extraout_XMM0_Db_01;
  fStack_40 = extraout_XMM0_Dc_01;
  fStack_3c = extraout_XMM0_Dd_01;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[4])(this);
  fVar7 = fVar2 * 0.2 + fVar7;
  fVar10 = in_XMM1_Da + fVar7;
  fVar11 = fVar1 * extraout_XMM0_Da_00;
  fVar13 = fVar1 * extraout_XMM0_Db_00;
  fVar2 = extraout_XMM0_Da_02 * 0.2 + local_48;
  fVar3 = extraout_XMM0_Db_02 * 0.2 + fStack_44;
  fVar4 = extraout_XMM0_Dc_02 * 0.0 + fStack_40;
  fVar5 = extraout_XMM0_Dd_02 * 0.0 + fStack_3c;
  fVar8 = extraout_XMM0_Da * fVar1 + fVar2;
  fVar9 = extraout_XMM0_Db * fVar1 + fVar3;
  local_48 = fVar11 + fVar8;
  fStack_44 = fVar13 + fVar9;
  fStack_40 = fVar1 * extraout_XMM0_Dc_00 + extraout_XMM0_Dc * fVar1 + fVar4;
  fStack_3c = fVar1 * extraout_XMM0_Dd_00 + extraout_XMM0_Dd * fVar1 + fVar5;
  fVar12 = fVar6 + fVar10;
  local_58.y = fStack_44;
  local_58.x = local_48;
  fVar7 = fVar7 - in_XMM1_Da;
  fVar2 = fVar2 - extraout_XMM0_Da * fVar1;
  fVar3 = fVar3 - extraout_XMM0_Db * fVar1;
  local_38 = fVar11 + fVar2;
  fStack_34 = fVar13 + fVar3;
  fStack_30 = fVar1 * extraout_XMM0_Dc_00 + (fVar4 - extraout_XMM0_Dc * fVar1);
  fStack_2c = fVar1 * extraout_XMM0_Dd_00 + (fVar5 - extraout_XMM0_Dd * fVar1);
  fVar1 = fVar6 + fVar7;
  local_68.y = fStack_34;
  local_68.x = local_38;
  local_68.z = fVar1;
  local_58.z = fVar12;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_58,&local_68,(Color *)OpenSteer::gWhite);
  fVar2 = fVar2 - fVar11;
  fVar3 = fVar3 - fVar13;
  fVar7 = fVar7 - fVar6;
  local_58.y = fVar3;
  local_58.x = fVar2;
  local_68.y = fStack_34;
  local_68.x = local_38;
  local_68.z = fVar1;
  local_58.z = fVar7;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_58,&local_68,(Color *)OpenSteer::gWhite);
  fVar8 = fVar8 - fVar11;
  fVar9 = fVar9 - fVar13;
  fVar10 = fVar10 - fVar6;
  local_68.y = fVar9;
  local_68.x = fVar8;
  local_68.z = fVar10;
  local_58.z = fVar7;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_58,&local_68,(Color *)OpenSteer::gWhite);
  local_58.y = fStack_44;
  local_58.x = local_48;
  local_68.z = fVar10;
  local_58.z = fVar12;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_58,&local_68,(Color *)OpenSteer::gWhite);
  return;
}

Assistant:

void annotationHintWasTaken (void)
        {
            if (!dtZero) hintTakenCount++;

            const float r = halfWidth * 0.9f;
            const Vec3 ff = forward () * r;
            const Vec3 ss = side () * r;
            const Vec3 pp = position () + (up () * 0.2f);
            annotationLine (pp + ff + ss, pp - ff + ss, gWhite);
            annotationLine (pp - ff - ss, pp - ff + ss, gWhite);
            annotationLine (pp - ff - ss, pp + ff - ss, gWhite);
            annotationLine (pp + ff + ss, pp + ff - ss, gWhite);

            //OpenSteerDemo::clock.setPausedState (true);
        }